

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>::
emplace_back<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
           *this,pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *args)

{
  ulong uVar1;
  SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>> *p;
  Expression *pEVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>> *pSVar6;
  long lVar7;
  SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>> *__src;
  long lVar8;
  ulong uVar9;
  
  __src = (SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
           *)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pEVar2 = args->second;
    *(ValueSymbol **)__src = args->first;
    *(Expression **)(__src + 8) = pEVar2;
    lVar8 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar8 + 1;
    return (reference)(*(long *)this + (lVar8 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)__src - *(long *)this;
  puVar4 = (undefined8 *)operator_new(uVar9 << 4);
  pEVar2 = args->second;
  *(undefined8 *)((long)puVar4 + lVar7) = args->first;
  ((undefined8 *)((long)puVar4 + lVar7))[1] = pEVar2;
  p = *(SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>> **)
       this;
  lVar8 = *(long *)(this + 8);
  pSVar6 = p;
  puVar5 = puVar4;
  if (p + (lVar8 * 0x10 - (long)__src) ==
      (SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>> *)
      0x0) {
    if (lVar8 != 0) {
      do {
        uVar3 = *(undefined8 *)(pSVar6 + 8);
        *puVar5 = *(undefined8 *)pSVar6;
        puVar5[1] = uVar3;
        pSVar6 = pSVar6 + 0x10;
        puVar5 = puVar5 + 2;
      } while (pSVar6 != __src);
    }
  }
  else {
    for (; pSVar6 != __src; pSVar6 = pSVar6 + 0x10) {
      uVar3 = *(undefined8 *)(pSVar6 + 8);
      *puVar5 = *(undefined8 *)pSVar6;
      puVar5[1] = uVar3;
      puVar5 = puVar5 + 2;
    }
    memcpy((void *)((long)puVar4 + lVar7 + 0x10),__src,
           ((ulong)(p + (lVar8 * 0x10 - (long)__src) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
    lVar8 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar8 + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(undefined8 **)this = puVar4;
  return (reference)((long)puVar4 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }